

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

Fl_Plugin * __thiscall Fl_Plugin_Manager::plugin(Fl_Plugin_Manager *this,char *name)

{
  Node *this_00;
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  Node *pNVar9;
  Fl_Plugin *pFVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Fl_Preferences pin;
  char buf [34];
  Fl_Preferences local_60;
  char local_48;
  undefined1 local_47 [16];
  
  this_00 = (this->super_Fl_Preferences).node;
  pFVar10 = (Fl_Plugin *)0x0;
  pNVar9 = Fl_Preferences::Node::search(this_00,name,0);
  if (pNVar9 != (Node *)0x0) {
    local_60._vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
    local_60.rootNode = (this->super_Fl_Preferences).rootNode;
    local_60.node = Fl_Preferences::Node::addChild(this_00,name);
    Fl_Preferences::get(&local_60,"address",&local_48,"",0x22);
    if (local_48 == '@') {
      auVar19 = _DAT_0021ca90 & local_47;
      sVar1 = auVar19._0_2_;
      sVar2 = auVar19._2_2_;
      auVar20[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar19[2] - (0xff < sVar2);
      auVar20[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar19[0] - (0xff < sVar1);
      sVar3 = auVar19._4_2_;
      auVar20[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar19[4] - (0xff < sVar3);
      sVar4 = auVar19._6_2_;
      auVar20[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar19[6] - (0xff < sVar4);
      sVar5 = auVar19._8_2_;
      auVar20[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar19[8] - (0xff < sVar5);
      sVar6 = auVar19._10_2_;
      auVar20[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar19[10] - (0xff < sVar6);
      sVar7 = auVar19._12_2_;
      auVar20[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar19[0xc] - (0xff < sVar7);
      sVar8 = auVar19._14_2_;
      auVar20[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar19[0xe] - (0xff < sVar8);
      auVar20[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar19[0] - (0xff < sVar1);
      auVar20[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar19[2] - (0xff < sVar2);
      auVar20[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar19[4] - (0xff < sVar3);
      auVar20[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar19[6] - (0xff < sVar4);
      auVar20[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar19[8] - (0xff < sVar5);
      auVar20[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar19[10] - (0xff < sVar6);
      auVar20[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar19[0xc] - (0xff < sVar7);
      auVar20[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar19[0xe] - (0xff < sVar8);
      uVar11 = local_47._0_2_ >> 8;
      uVar12 = local_47._2_2_ >> 8;
      uVar13 = local_47._4_2_ >> 8;
      uVar14 = local_47._6_2_ >> 8;
      uVar15 = local_47._8_2_ >> 8;
      uVar16 = local_47._10_2_ >> 8;
      uVar17 = local_47._12_2_ >> 8;
      uVar18 = local_47._14_2_ >> 8;
      auVar19 = psllw(auVar20,4);
      auVar19 = auVar19 & _DAT_0021caa0;
      pFVar10 = (Fl_Plugin *)
                (CONCAT17(((uVar18 != 0) * (uVar18 < 0x100) * local_47[0xf] - (0xff < uVar18)) +
                          -0x41,CONCAT16(((uVar17 != 0) * (uVar17 < 0x100) * local_47[0xd] -
                                         (0xff < uVar17)) + -0x41,
                                         CONCAT15(((uVar16 != 0) * (uVar16 < 0x100) * local_47[0xb]
                                                  - (0xff < uVar16)) + -0x41,
                                                  CONCAT14(((uVar15 != 0) * (uVar15 < 0x100) *
                                                            local_47[9] - (0xff < uVar15)) + -0x41,
                                                           CONCAT13(((uVar14 != 0) *
                                                                     (uVar14 < 0x100) * local_47[7]
                                                                    - (0xff < uVar14)) + -0x41,
                                                                    CONCAT12(((uVar13 != 0) *
                                                                              (uVar13 < 0x100) *
                                                                              local_47[5] -
                                                                             (0xff < uVar13)) +
                                                                             -0x41,CONCAT11(((uVar12
                                                                                             != 0) *
                                                                                             (uVar12
                                                                                             < 0x100
                                                  ) * local_47[3] - (0xff < uVar12)) + -0x41,
                                                  ((uVar11 != 0) * (uVar11 < 0x100) * local_47[1] -
                                                  (0xff < uVar11)) + -0x41))))))) |
                CONCAT17(auVar19[7] + -0x10,
                         CONCAT16(auVar19[6] + -0x10,
                                  CONCAT15(auVar19[5] + -0x10,
                                           CONCAT14(auVar19[4] + -0x10,
                                                    CONCAT13(auVar19[3] + -0x10,
                                                             CONCAT12(auVar19[2] + -0x10,
                                                                      CONCAT11(auVar19[1] + -0x10,
                                                                               auVar19[0] + -0x10)))
                                                   )))));
    }
    else {
      pFVar10 = (Fl_Plugin *)0x0;
    }
    ~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_60);
  }
  return pFVar10;
}

Assistant:

Fl_Plugin *Fl_Plugin_Manager::plugin(const char *name) {
  char buf[34];
  Fl_Plugin *ret = 0;
  if (groupExists(name)) {
    Fl_Preferences pin(this, name);
    pin.get("address", buf, "", 34);
    if (buf[0]=='@') ret = (Fl_Plugin*)a2p(buf+1);
#ifdef FL_PLUGIN_VERBOSE
    printf("Fl_Plugin: returning plugin named \"%s\": (%s) %p\n", name, buf, ret);
#endif
    return ret;
  } else {
#ifdef FL_PLUGIN_VERBOSE
    printf("Fl_Plugin: no plugin found named \"%s\"\n", name);
#endif
    return 0L;
  }
}